

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTrace.cpp
# Opt level: O1

bool idx2::PrintStacktrace(printer *Pr)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  char *pcVar5;
  undefined1 *puVar6;
  FILE *__stream;
  char *pcVar7;
  undefined1 *puVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  int Status;
  size_t FuncNameSize;
  void *AddrList [64];
  char Buffer [128];
  char Buffer_1 [1024];
  char Syscom [1024];
  int local_acc;
  ulong local_ac8;
  undefined8 local_ac0;
  undefined8 local_ab8 [64];
  undefined1 local_8b8 [128];
  char local_838 [1024];
  char local_438 [1032];
  
  pcVar7 = Pr->Buf;
  if (pcVar7 == (char *)0x0) {
LAB_00105218:
    if ((FILE *)Pr->File == (FILE *)0x0) {
LAB_00105741:
      pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
LAB_00105748:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                    ,0x6c,"bool idx2::PrintStacktrace(printer *)");
    }
    fwrite("Stack trace:\n",0xd,1,(FILE *)Pr->File);
  }
  else {
    if (Pr->File != (FILE *)0x0) {
      if (pcVar7 == (char *)0x0) goto LAB_00105218;
      goto LAB_00105741;
    }
    if ((long)Pr->Size < 2) {
      pcVar7 = "false && \"buffer too small\"";
      goto LAB_00105748;
    }
    iVar3 = snprintf(pcVar7,(long)Pr->Size,"Stack trace:\n");
    Pr->Buf = Pr->Buf + iVar3;
    iVar4 = Pr->Size - iVar3;
    if (iVar4 == 0 || Pr->Size < iVar3) {
      pcVar7 = "false && \"buffer overflow?\"";
      goto LAB_00105748;
    }
    Pr->Size = iVar4;
  }
  uVar2 = backtrace(local_ab8,0x40);
  if (uVar2 != 0) {
    __ptr = (void *)backtrace_symbols(local_ab8,uVar2);
    local_ac0 = 0x80;
    if (1 < (int)uVar2) {
      local_ac8 = (ulong)uVar2;
      puVar8 = local_8b8;
      uVar9 = 1;
LAB_001052cc:
      pcVar7 = *(char **)((long)__ptr + uVar9 * 8);
      pcVar5 = pcVar7;
      pcVar11 = (char *)0x0;
      pcVar13 = (char *)0x0;
LAB_001052de:
      cVar1 = *pcVar5;
      pcVar10 = pcVar5;
      pcVar12 = pcVar13;
      if ((cVar1 == '(') || (pcVar10 = pcVar11, pcVar12 = pcVar5, cVar1 == '+')) {
LAB_0010530b:
        pcVar5 = pcVar5 + 1;
        pcVar11 = pcVar10;
        pcVar13 = pcVar12;
        goto LAB_001052de;
      }
      if (cVar1 != '\0') {
        pcVar12 = pcVar13;
        if (cVar1 == ')' && pcVar13 != (char *)0x0) goto LAB_00105312;
        goto LAB_0010530b;
      }
      pcVar5 = (char *)0x0;
LAB_00105312:
      if (pcVar11 < pcVar13 &&
          (pcVar5 != (char *)0x0 && (pcVar13 != (char *)0x0 && pcVar11 != (char *)0x0))) {
        *pcVar11 = '\0';
        pcVar11 = pcVar11 + 1;
        *pcVar13 = '\0';
        pcVar13 = pcVar13 + 1;
        *pcVar5 = '\0';
        puVar6 = (undefined1 *)__cxa_demangle(pcVar11,puVar8,&local_ac0,&local_acc);
        pcVar7 = Pr->Buf;
        if (local_acc == 0) {
          puVar8 = puVar6;
          if (pcVar7 == (char *)0x0) {
LAB_00105422:
            if ((FILE *)Pr->File != (FILE *)0x0) {
              fprintf((FILE *)Pr->File,"  %s: %s +%s [%p]\n",
                      *(undefined8 *)((long)__ptr + uVar9 * 8),puVar6,pcVar13,local_ab8[uVar9]);
              goto LAB_001054da;
            }
          }
          else {
            if (Pr->File == (FILE *)0x0) {
              if ((long)Pr->Size < 2) {
                pcVar7 = "false && \"buffer too small\"";
                goto LAB_00105717;
              }
              iVar3 = snprintf(pcVar7,(long)Pr->Size,"  %s: %s +%s [%p]\n",
                               *(undefined8 *)((long)__ptr + uVar9 * 8),puVar6,pcVar13,
                               local_ab8[uVar9]);
              Pr->Buf = Pr->Buf + iVar3;
              iVar4 = Pr->Size - iVar3;
              if (iVar4 == 0 || Pr->Size < iVar3) {
                pcVar7 = "false && \"buffer overflow?\"";
                goto LAB_00105717;
              }
              Pr->Size = iVar4;
              goto LAB_001054da;
            }
            if (pcVar7 == (char *)0x0) goto LAB_00105422;
          }
          pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
LAB_00105717:
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                        ,0x9a,"bool idx2::PrintStacktrace(printer *)");
        }
        if (pcVar7 == (char *)0x0) {
LAB_0010538c:
          if ((FILE *)Pr->File == (FILE *)0x0) {
LAB_001056f1:
            pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
LAB_001056f8:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                          ,0x9e,"bool idx2::PrintStacktrace(printer *)");
          }
          fprintf((FILE *)Pr->File,"  %s: %s() +%s [%p]\n",*(undefined8 *)((long)__ptr + uVar9 * 8),
                  pcVar11,pcVar13,local_ab8[uVar9]);
        }
        else {
          if (Pr->File != (FILE *)0x0) {
            if (pcVar7 == (char *)0x0) goto LAB_0010538c;
            goto LAB_001056f1;
          }
          if ((long)Pr->Size < 2) {
            pcVar7 = "false && \"buffer too small\"";
            goto LAB_001056f8;
          }
          iVar3 = snprintf(pcVar7,(long)Pr->Size,"  %s: %s() +%s [%p]\n",
                           *(undefined8 *)((long)__ptr + uVar9 * 8),pcVar11,pcVar13,local_ab8[uVar9]
                          );
          Pr->Buf = Pr->Buf + iVar3;
          iVar4 = Pr->Size - iVar3;
          if (iVar4 == 0 || Pr->Size < iVar3) {
            pcVar7 = "false && \"buffer overflow?\"";
            goto LAB_001056f8;
          }
          Pr->Size = iVar4;
        }
LAB_001054da:
        snprintf(local_438,0x400,"addr2line %p -e %s",local_ab8[uVar9],"main");
        __stream = popen(local_438,"r");
        if (__stream != (FILE *)0x0) {
          memset(local_838,0,0x400);
LAB_0010552e:
          do {
            pcVar7 = fgets(local_838,0x400,__stream);
            if (pcVar7 == (char *)0x0) goto LAB_001055a8;
            pcVar7 = Pr->Buf;
            if (pcVar7 != (char *)0x0) {
              if (Pr->File == (FILE *)0x0) {
                if (1 < (long)Pr->Size) {
                  iVar3 = snprintf(pcVar7,(long)Pr->Size,"    %s",local_838);
                  Pr->Buf = Pr->Buf + iVar3;
                  iVar4 = Pr->Size - iVar3;
                  if (iVar4 == 0 || Pr->Size < iVar3) {
                    pcVar7 = "false && \"buffer overflow?\"";
                    goto LAB_001056a8;
                  }
                  Pr->Size = iVar4;
                  goto LAB_0010552e;
                }
                pcVar7 = "false && \"buffer too small\"";
              }
              else {
                if (pcVar7 == (char *)0x0) goto LAB_0010555b;
LAB_001056a1:
                pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
              }
LAB_001056a8:
              __assert_fail(pcVar7,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                            ,0xaa,"bool idx2::PrintStacktrace(printer *)");
            }
LAB_0010555b:
            if ((FILE *)Pr->File == (FILE *)0x0) goto LAB_001056a1;
            fprintf((FILE *)Pr->File,"    %s",local_838);
          } while( true );
        }
      }
      else {
        pcVar5 = Pr->Buf;
        if (pcVar5 == (char *)0x0) {
LAB_001053dc:
          if ((FILE *)Pr->File == (FILE *)0x0) {
LAB_001056d2:
            pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
LAB_001056d9:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                          ,0xb0,"bool idx2::PrintStacktrace(printer *)");
          }
          fprintf((FILE *)Pr->File,"  %s\n",pcVar7);
        }
        else {
          if (Pr->File != (FILE *)0x0) {
            if (pcVar5 == (char *)0x0) goto LAB_001053dc;
            goto LAB_001056d2;
          }
          if ((long)Pr->Size < 2) {
            pcVar7 = "false && \"buffer too small\"";
            goto LAB_001056d9;
          }
          iVar3 = snprintf(pcVar5,(long)Pr->Size,"  %s\n");
          Pr->Buf = Pr->Buf + iVar3;
          iVar4 = Pr->Size - iVar3;
          if (iVar4 == 0 || Pr->Size < iVar3) {
            pcVar7 = "false && \"buffer overflow?\"";
            goto LAB_001056d9;
          }
          Pr->Size = iVar4;
        }
      }
      goto LAB_001055b0;
    }
LAB_0010560d:
    free(__ptr);
    goto LAB_0010568a;
  }
  pcVar7 = Pr->Buf;
  if (pcVar7 == (char *)0x0) {
LAB_00105635:
    if ((FILE *)Pr->File != (FILE *)0x0) {
      fwrite("  <empty, possibly corrupt>\n",0x1c,1,(FILE *)Pr->File);
LAB_0010568a:
      return uVar2 != 0;
    }
  }
  else {
    if (Pr->File == (FILE *)0x0) {
      if ((long)Pr->Size < 2) {
        pcVar7 = "false && \"buffer too small\"";
      }
      else {
        iVar3 = snprintf(pcVar7,(long)Pr->Size,"  <empty, possibly corrupt>\n");
        Pr->Buf = Pr->Buf + iVar3;
        iVar4 = Pr->Size - iVar3;
        if (iVar4 != 0 && iVar3 <= Pr->Size) {
          Pr->Size = iVar4;
          goto LAB_0010568a;
        }
        pcVar7 = "false && \"buffer overflow?\"";
      }
      goto LAB_0010578b;
    }
    if (pcVar7 == (char *)0x0) goto LAB_00105635;
  }
  pcVar7 = "false && \"unavailable or ambiguous printer destination\"";
LAB_0010578b:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/StackTrace.cpp"
                ,0x73,"bool idx2::PrintStacktrace(printer *)");
LAB_001055a8:
  pclose(__stream);
LAB_001055b0:
  uVar9 = uVar9 + 1;
  if (uVar9 == local_ac8) goto LAB_0010560d;
  goto LAB_001052cc;
}

Assistant:

bool
PrintStacktrace(printer* Pr)
{
  idx2_Print(Pr, "Stack trace:\n");
  constexpr int MaxFrames = 63;
  void* AddrList[MaxFrames + 1]; // Storage array for stack trace address data
  /* Retrieve current stack addresses */
  int AddrLen = backtrace(AddrList, sizeof(AddrList) / sizeof(void*));
  if (AddrLen == 0)
  {
    idx2_Print(Pr, "  <empty, possibly corrupt>\n");
    return false;
  }
  /* Resolve addresses into strings containing "filename(function+address)", */
  char** SymbolList = backtrace_symbols(AddrList, AddrLen);
  size_t FuncNameSize = 128;
  char Buffer[128];
  char* FuncName = Buffer;
  // iterate over the returned symbol lines (skip the first)
  for (int I = 1; I < AddrLen; ++I)
  {
    // fprintf(stderr, "%s\n", SymbolList[I]);
    char *BeginName = 0, *BeginOffset = 0, *EndOffset = 0;
    /* Find parentheses and +address offset surrounding the mangled name:
    e.g., ./module(function+0x15c) [0x8048a6d] */
    for (char* P = SymbolList[I]; *P; ++P)
    {
      if (*P == '(')
        BeginName = P;
      else if (*P == '+')
        BeginOffset = P;
      else if (*P == ')' && BeginOffset)
      {
        EndOffset = P;
        break;
      }
    }
    if (BeginName && BeginOffset && EndOffset && BeginName < BeginOffset)
    {
      *BeginName++ = '\0';
      *BeginOffset++ = '\0';
      *EndOffset = '\0';
      /* mangled name is now in [BeginName, BeginOffset) and caller offset in
[BeginOffset, EndOffset) */
      int Status;
      char* Ret = abi::__cxa_demangle(BeginName, FuncName, &FuncNameSize, &Status);
      if (Status == 0)
      {
        FuncName = Ret; // use possibly realloc()-ed string
        idx2_Print(Pr, "  %s: %s +%s [%p]\n", SymbolList[I], FuncName, BeginOffset, AddrList[I]);
      }
      else
      { // demangling failed
        idx2_Print(Pr, "  %s: %s() +%s [%p]\n", SymbolList[I], BeginName, BeginOffset, AddrList[I]);
      }
      /* get file names and line numbers using addr2line */
      constexpr int BufLen = 1024;
      char Syscom[BufLen];
      // last parameter is the name of this app
      snprintf(Syscom, BufLen, "addr2line %p -e %s", AddrList[I], "main");
      FILE* F = popen(Syscom, "r");
      if (F)
      {
        char Buffer[BufLen] = { 0 };
        while (fgets(Buffer, sizeof(Buffer), F))
          idx2_Print(Pr, "    %s", Buffer);
        pclose(F);
      }
    }
    else
    { // couldn't parse the line? print the whole line.
      idx2_Print(Pr, "  %s\n", SymbolList[I]);
    }
  }
  free(SymbolList);
  return true;
}